

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O0

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CCompExp *expression)

{
  pointer pIVar1;
  CRelativeConditionalWrapper *pCVar2;
  pointer pIVar3;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_80;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_78;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_70;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_68;
  undefined1 local_59;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_58;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_50;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_48;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_40;
  unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> local_38;
  unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> wrapperRight;
  unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> local_20;
  unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> wrapperLeft;
  CCompExp *expression_local;
  CBuildVisitor *this_local;
  
  wrapperLeft._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl =
       (__uniq_ptr_data<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>,_true,_true>
       )(__uniq_ptr_data<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>,_true,_true>
         )expression;
  std::operator<<((ostream *)&std::cout,"IRT builder: CCompExp\n");
  pIVar1 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                     ((unique_ptr<IExpression,_std::default_delete<IExpression>_> *)
                      ((long)wrapperLeft._M_t.
                             super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                             .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl +
                      0x18));
  (**(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::unique_ptr
            (&local_20,&this->wrapper);
  pIVar1 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                     ((unique_ptr<IExpression,_std::default_delete<IExpression>_> *)
                      ((long)wrapperLeft._M_t.
                             super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                             .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl +
                      0x20));
  (**(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::unique_ptr
            (&local_38,&this->wrapper);
  if (*(int *)((long)wrapperLeft._M_t.
                     super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                     .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl + 0x28) == 2
     ) {
    pCVar2 = (CRelativeConditionalWrapper *)operator_new(0x20);
    local_59 = 1;
    pIVar3 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
             operator->(&local_20);
    (**pIVar3->_vptr_ISubtreeWrapper)(&local_48);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_40,&local_48);
    pIVar3 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
             operator->(&local_38);
    (**pIVar3->_vptr_ISubtreeWrapper)(&local_58);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_50,&local_58);
    IRT::CRelativeConditionalWrapper::CRelativeConditionalWrapper(pCVar2,LESS,&local_40,&local_50);
    local_59 = 0;
    updateSubtreeWrapper(this,(ISubtreeWrapper *)pCVar2);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_50);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_58);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_40);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_48);
  }
  if (*(int *)((long)wrapperLeft._M_t.
                     super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                     .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl + 0x28) == 0
     ) {
    pCVar2 = (CRelativeConditionalWrapper *)operator_new(0x20);
    pIVar3 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
             operator->(&local_20);
    (**pIVar3->_vptr_ISubtreeWrapper)(&local_70);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_68,&local_70);
    pIVar3 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
             operator->(&local_38);
    (**pIVar3->_vptr_ISubtreeWrapper)(&local_80);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_78,&local_80);
    IRT::CRelativeConditionalWrapper::CRelativeConditionalWrapper
              (pCVar2,GREATER,&local_68,&local_78);
    updateSubtreeWrapper(this,(ISubtreeWrapper *)pCVar2);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_78);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_80);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_68);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_70);
  }
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
            (&local_38);
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
            (&local_20);
  return;
}

Assistant:

void CBuildVisitor::Visit( CCompExp &expression ) {
    std::cout << "IRT builder: CCompExp\n";
    expression.leftOperand->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> wrapperLeft = std::move( wrapper );

    expression.rightOperand->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> wrapperRight = std::move( wrapper );

    if ( expression.operation == enums::TCompareOperation::LESS ) {
        updateSubtreeWrapper( new IRT::CRelativeConditionalWrapper(
                IRT::enums::TLogicOperator::LESS,
                std::move( wrapperLeft->ToExpression( )),
                std::move( wrapperRight->ToExpression( ))
        ));
    }

    if ( expression.operation == enums::TCompareOperation::GREATER ) {
        updateSubtreeWrapper( new IRT::CRelativeConditionalWrapper(
                IRT::enums::TLogicOperator::GREATER,
                std::move( wrapperLeft->ToExpression( )),
                std::move( wrapperRight->ToExpression( ))
        ));
    }
}